

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O3

int16_t spell_chance(wchar_t spell_index)

{
  short sVar1;
  class_spell *pcVar2;
  loc grid;
  wchar_t *pwVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  wchar_t *pwVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  int iVar10;
  ulong uVar11;
  
  wVar9 = (player->class->magic).total_spells;
  iVar10 = 100;
  if (((spell_index < wVar9) && (L'\xffffffff' < spell_index)) && (wVar9 != L'\0')) {
    pwVar3 = &((player->class->magic).books)->num_spells;
    wVar9 = L'\0';
    do {
      wVar8 = wVar9;
      pwVar7 = pwVar3;
      wVar9 = *pwVar7 + wVar8;
      pwVar3 = pwVar7 + 8;
    } while (wVar9 <= spell_index);
    pcVar2 = *(class_spell **)(pwVar7 + 3);
    if (pcVar2 != (class_spell *)0x0) {
      iVar6 = spell_index - wVar8;
      uVar11 = (ulong)(player->state).stat_ind[(pcVar2[iVar6].realm)->stat];
      iVar5 = pcVar2[iVar6].smana - (int)player->csp;
      iVar10 = iVar5 * 5;
      if (iVar5 == 0 || pcVar2[iVar6].smana < (int)player->csp) {
        iVar10 = 0;
      }
      iVar10 = iVar10 + ((pcVar2[iVar6].sfail + ((int)player->lev - pcVar2[iVar6].slevel) * -3) -
                        adj_mag_stat[uVar11]);
      iVar5 = adj_mag_fail[uVar11];
      _Var4 = flag_has_dbg((player->state).pflags,10,0x2d,"player->state.pflags","(PF_STRONG_MAGIC)"
                          );
      iVar6 = 5;
      if (_Var4) {
        iVar6 = iVar5;
      }
      if (uVar11 < 0x14) {
        iVar6 = iVar5;
      }
      _Var4 = flag_has_dbg((player->state).pflags,10,0x1f,"player->state.pflags","(PF_UNLIGHT)");
      iVar5 = iVar10;
      if (_Var4) {
        grid.x = (player->grid).x;
        grid.y = (player->grid).y;
        _Var4 = square_islit(cave,grid);
        iVar5 = iVar10 + 0x19;
        if (!_Var4) {
          iVar5 = iVar10;
        }
      }
      _Var4 = player_of_has(player,L'\x1c');
      iVar10 = iVar5 + 0x14;
      if (!_Var4) {
        iVar10 = iVar5;
      }
      if (iVar10 <= iVar6) {
        iVar10 = iVar6;
      }
      iVar5 = 0x32;
      if (iVar10 < 0x32) {
        iVar5 = iVar10;
      }
      sVar1 = player->timed[9];
      iVar10 = iVar5 + 0xf;
      if (sVar1 == 0) {
        iVar10 = iVar5;
      }
      if (0x32 < sVar1) {
        iVar10 = iVar5 + 0x19;
      }
      if (player->timed[0x19] != 0) {
        iVar10 = iVar10 / 2 + 0x32;
      }
    }
  }
  return (int16_t)iVar10;
}

Assistant:

int16_t spell_chance(int spell_index)
{
	int chance = 100, minfail;

	const struct class_spell *spell;

	/* Paranoia -- must be literate */
	if (!player->class->magic.total_spells) return chance;

	/* Get the spell */
	spell = spell_by_index(player, spell_index);
	if (!spell) return chance;

	/* Extract the base spell failure rate */
	chance = spell->sfail;

	/* Reduce failure rate by "effective" level adjustment */
	chance -= 3 * (player->lev - spell->slevel);

	/* Reduce failure rate by casting stat level adjustment */
	chance -= fail_adjust(player, spell);

	/* Not enough mana to cast */
	if (spell->smana > player->csp)
		chance += 5 * (spell->smana - player->csp);

	/* Get the minimum failure rate for the casting stat level */
	minfail = min_fail(player, spell);

	/* Non-full spellcasters never get better than 5 percent */
	if (!player_has(player, PF_STRONG_MAGIC) && minfail < 5) {
		minfail = 5;
	}

	/* Necromancers are punished by being on lit squares */
	if (player_has(player, PF_UNLIGHT) && square_islit(cave, player->grid)) {
		chance += 25;
	}

	/* Fear makes spells harder (before minfail) */
	/* Note that spells that remove fear have a much lower fail rate than
	 * surrounding spells, to make sure this doesn't cause mega fail */
	if (player_of_has(player, OF_AFRAID)) chance += 20;

	/* Minimal and maximal failure rate */
	if (chance < minfail) chance = minfail;
	if (chance > 50) chance = 50;

	/* Stunning makes spells harder (after minfail) */
	if (player->timed[TMD_STUN] > 50) {
		chance += 25;
	} else if (player->timed[TMD_STUN]) {
		chance += 15;
	}

	/* Amnesia makes spells very difficult */
	if (player->timed[TMD_AMNESIA]) {
		chance = 50 + chance / 2;
	}

	/* Always a 5 percent chance of working */
	if (chance > 95) {
		chance = 95;
	}

	/* Return the chance */
	return (chance);
}